

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

void __thiscall
Js::JavascriptLibrary::SetCrossSiteForLockedNonBuiltInFunctionType
          (JavascriptLibrary *this,JavascriptFunction *function)

{
  FunctionInfo *pFVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  DynamicType *in_RAX;
  FunctionProxy *this_00;
  DynamicTypeHandler *pDVar5;
  ScriptFunctionType *pSVar6;
  PathTypeHandlerBase *pPVar7;
  undefined4 *puVar8;
  ScriptFunction *pSVar9;
  undefined4 extraout_var;
  DynamicType *local_38;
  DynamicType *type;
  
  local_38 = in_RAX;
  this_00 = JavascriptFunction::GetFunctionProxy(function);
  pDVar5 = DynamicObject::GetTypeHandler(&function->super_DynamicObject);
  iVar4 = (*pDVar5->_vptr_DynamicTypeHandler[0x4d])(pDVar5);
  if (iVar4 == 0) {
    if (this_00 != (FunctionProxy *)0x0) {
      pSVar6 = FunctionProxy::GetCrossSiteUndeferredFunctionType(this_00);
      if (pSVar6 != (ScriptFunctionType *)0x0) {
        pSVar6 = FunctionProxy::GetCrossSiteUndeferredFunctionType(this_00);
        goto LAB_00bfd9cc;
      }
    }
    iVar4 = (*pDVar5->_vptr_DynamicTypeHandler[0x4e])(pDVar5);
    if (iVar4 == 0) {
      DynamicObject::ChangeType(&function->super_DynamicObject);
    }
    else {
      bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,ShareCrossSiteFuncTypesPhase);
      if (bVar3) {
        pPVar7 = PathTypeHandlerBase::FromTypeHandler(pDVar5);
        PathTypeHandlerBase::ConvertToNonShareableTypeHandler(pPVar7,&function->super_DynamicObject)
        ;
      }
      else {
        iVar4 = (*(function->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x67])(function);
        local_38 = (DynamicType *)CONCAT44(extraout_var,iVar4);
        pPVar7 = PathTypeHandlerBase::FromTypeHandler(pDVar5);
        PathTypeHandlerBase::BuildPathTypeFromNewRoot
                  (pPVar7,&function->super_DynamicObject,&local_38);
        DynamicObject::ReplaceType(&function->super_DynamicObject,local_38);
      }
    }
    JavascriptFunction::SetEntryPoint
              (function,((this->super_JavascriptLibraryBase).scriptContext.ptr)->
                        CurrentCrossSiteThunk);
    if (this_00 != (FunctionProxy *)0x0) {
      if ((this_00->functionInfo).ptr == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x537,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar3) goto LAB_00bfdd22;
        *puVar8 = 0;
      }
      if ((((this_00->functionInfo).ptr)->functionBodyImpl).ptr != this_00) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x538,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                    "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar3) goto LAB_00bfdd22;
        *puVar8 = 0;
      }
      pFVar1 = (this_00->functionInfo).ptr;
      if (((pFVar1->functionBodyImpl).ptr != (FunctionProxy *)0x0) &&
         ((pFVar1->attributes & DeferredDeserialize) == None)) {
        pDVar5 = DynamicObject::GetTypeHandler(&function->super_DynamicObject);
        if ((pDVar5->flags & 8) != 0) {
          bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,ShareCrossSiteFuncTypesPhase);
          if (!bVar3) {
            DynamicObject::ShareType(&function->super_DynamicObject);
            pSVar9 = UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(function);
            pSVar6 = ScriptFunction::GetScriptFunctionType(pSVar9);
            FunctionProxy::SetCrossSiteUndeferredFunctionType(this_00,pSVar6);
          }
        }
      }
    }
  }
  else {
    if (this_00 == (FunctionProxy *)0x0) {
      DynamicObject::ChangeType(&function->super_DynamicObject);
      JavascriptFunction::SetEntryPoint
                (function,((this->super_JavascriptLibraryBase).scriptContext.ptr)->
                          CurrentCrossSiteThunk);
      return;
    }
    pSVar6 = FunctionProxy::GetCrossSiteDeferredFunctionType(this_00);
    if (pSVar6 != (ScriptFunctionType *)0x0) {
      pSVar6 = FunctionProxy::GetCrossSiteDeferredFunctionType(this_00);
LAB_00bfd9cc:
      DynamicObject::ReplaceType(&function->super_DynamicObject,&pSVar6->super_DynamicType);
      return;
    }
    DynamicObject::ChangeType(&function->super_DynamicObject);
    JavascriptFunction::SetEntryPoint
              (function,((this->super_JavascriptLibraryBase).scriptContext.ptr)->
                        CurrentCrossSiteThunk);
    if ((this_00->functionInfo).ptr == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x537,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) goto LAB_00bfdd22;
      *puVar8 = 0;
    }
    if ((((this_00->functionInfo).ptr)->functionBodyImpl).ptr != this_00) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x538,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar3) {
LAB_00bfdd22:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    pFVar1 = (this_00->functionInfo).ptr;
    if (((pFVar1->functionBodyImpl).ptr != (FunctionProxy *)0x0) &&
       ((pFVar1->attributes & DeferredDeserialize) == None)) {
      bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,ShareCrossSiteFuncTypesPhase);
      if (!bVar3) {
        DynamicObject::ShareType(&function->super_DynamicObject);
        pSVar9 = UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(function);
        pSVar6 = ScriptFunction::GetScriptFunctionType(pSVar9);
        FunctionProxy::SetCrossSiteDeferredFunctionType(this_00,pSVar6);
        return;
      }
    }
  }
  return;
}

Assistant:

void JavascriptLibrary::SetCrossSiteForLockedNonBuiltInFunctionType(JavascriptFunction * function)
    {
        FunctionProxy * functionProxy = function->GetFunctionProxy();
        DynamicTypeHandler *typeHandler = function->GetTypeHandler();
        if (typeHandler->IsDeferredTypeHandler())
        {
            if (functionProxy && functionProxy->GetCrossSiteDeferredFunctionType())
            {
                function->ReplaceType(functionProxy->GetCrossSiteDeferredFunctionType());
            }
            else
            {
                function->ChangeType();
                function->SetEntryPoint(scriptContext->CurrentCrossSiteThunk);
                if (functionProxy && functionProxy->HasParseableInfo() && !PHASE_OFF1(ShareCrossSiteFuncTypesPhase))
                {
                    function->ShareType();
                    functionProxy->SetCrossSiteDeferredFunctionType(UnsafeVarTo<ScriptFunction>(function)->GetScriptFunctionType());
                }
            }
        }
        else 
        {
            if (functionProxy && functionProxy->GetCrossSiteUndeferredFunctionType())
            {
                function->ReplaceType(functionProxy->GetCrossSiteUndeferredFunctionType());
            }
            else
            {
                if (typeHandler->IsPathTypeHandler())
                {
                    if (!PHASE_OFF1(ShareCrossSiteFuncTypesPhase))
                    {
                        DynamicType *type = function->DuplicateType();
                        PathTypeHandlerBase::FromTypeHandler(typeHandler)->BuildPathTypeFromNewRoot(function, &type);
                        function->ReplaceType(type);
                    }
                    else
                    {
                        PathTypeHandlerBase::FromTypeHandler(typeHandler)->ConvertToNonShareableTypeHandler(function);
                    }
                }
                else
                {
                    function->ChangeType();
                }
                function->SetEntryPoint(scriptContext->CurrentCrossSiteThunk);
                if (functionProxy && functionProxy->HasParseableInfo() && function->GetTypeHandler()->GetMayBecomeShared() && !PHASE_OFF1(ShareCrossSiteFuncTypesPhase))
                {
                    function->ShareType();
                    functionProxy->SetCrossSiteUndeferredFunctionType(UnsafeVarTo<ScriptFunction>(function)->GetScriptFunctionType());
                }
            }
        }
    }